

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InductionHelper.cpp
# Opt level: O0

bool Inferences::anon_unknown_1::isIntegerComparisonLiteral(Literal *lit)

{
  bool bVar1;
  Interpretation IVar2;
  Theory *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  bool local_1;
  
  bVar1 = Kernel::Term::ground((Term *)0x7f0653);
  if ((bVar1) &&
     (bVar1 = Kernel::Theory::isInterpretedPredicate
                        (in_RDI,(Literal *)
                                CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)),
     bVar1)) {
    IVar2 = Kernel::Theory::interpretPredicate
                      (in_RDI,(Literal *)
                              CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if ((IVar2 - INT_GREATER < 2) || (IVar2 != INT_LESS)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool isIntegerComparisonLiteral(Literal* lit) {
  if (!lit->ground() || !theory->isInterpretedPredicate(lit)) return false;
  switch (theory->interpretPredicate(lit)) {
    case Theory::INT_LESS:
      // The only supported integer comparison predicate is INT_LESS.
      break;
    case Theory::INT_LESS_EQUAL:
    case Theory::INT_GREATER_EQUAL:
    case Theory::INT_GREATER:
      // All formulas should be normalized to only use INT_LESS and not other integer comparison predicates.

      // Equality proxy may generate useless congruence axioms for the likes of INT_GREATER
      // (although they only appeared in the input and are eliminated by now -> but this also means they are safe to ingore)
      ASS_EQ(env.options->equalityProxy(),Options::EqualityProxy::RSTC);
    default:
      // Not an integer comparison.
      return false;
  }
  return true;
}